

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::AddIncludeDirectory(cmGeneratorTarget *this,string *src,bool before)

{
  cmTarget *this_00;
  const_iterator __position;
  TargetPropertyEntryVector *pTVar1;
  cmake *propertyValue;
  pointer *__ptr;
  undefined1 local_c8 [8];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  
  this_00 = this->Target;
  std::__cxx11::string::string((string *)&local_80,(string *)src);
  cmMakefile::GetBacktrace((cmMakefile *)local_b0);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_60,&local_80,(cmListFileBacktrace *)local_b0);
  cmTarget::InsertInclude(this_00,&local_60,before);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
  std::__cxx11::string::~string((string *)&local_80);
  pTVar1 = (TargetPropertyEntryVector *)
           &(this->IncludeDirectoriesEntries).
            super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (before) {
    pTVar1 = &this->IncludeDirectoriesEntries;
  }
  __position._M_current =
       (pTVar1->
       super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  propertyValue = cmMakefile::GetCMakeInstance(this->Makefile);
  std::__cxx11::string::string((string *)&local_a0,(string *)src);
  cmMakefile::GetBacktrace((cmMakefile *)local_c0);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_60,&local_a0,(cmListFileBacktrace *)local_c0);
  CreateTargetPropertyEntry
            ((cmake *)local_c8,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )propertyValue,SUB81(&local_60,0));
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::_M_insert_rval(&this->IncludeDirectoriesEntries,__position,(value_type *)local_c8);
  if ((tuple<cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
       )local_c8 != (_Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>)0x0) {
    (**(code **)((long)*(__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                         *)local_c8 + 8))();
  }
  local_c8 = (undefined1  [8])0x0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void cmGeneratorTarget::AddIncludeDirectory(const std::string& src,
                                            bool before)
{
  this->Target->InsertInclude(
    BT<std::string>(src, this->Makefile->GetBacktrace()), before);
  this->IncludeDirectoriesEntries.insert(
    before ? this->IncludeDirectoriesEntries.begin()
           : this->IncludeDirectoriesEntries.end(),
    CreateTargetPropertyEntry(
      *this->Makefile->GetCMakeInstance(),
      BT<std::string>(src, this->Makefile->GetBacktrace()), true));
}